

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int write_skip_mode(AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t segment_id,MB_MODE_INFO *mi,aom_writer *w
                   )

{
  int iVar1;
  uint nsymbs;
  BLOCK_SIZE *in_RCX;
  uint8_t in_DL;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  aom_cdf_prob *in_R8;
  int ctx;
  int skip_mode;
  int symb;
  undefined7 in_stack_ffffffffffffffe0;
  
  if ((*(int *)(in_RDI + 0x18) != 0) &&
     (iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\x06'), iVar1 == 0)) {
    nsymbs = (uint)((byte)((ushort)*(undefined2 *)(in_RCX + 0xa7) >> 6) & 1);
    iVar1 = is_comp_ref_allowed(*in_RCX);
    symb = (int)((ulong)in_RCX >> 0x20);
    if ((iVar1 != 0) &&
       ((iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\x05'), iVar1 == 0 &&
        (iVar1 = segfeature_active((segmentation *)(in_RDI + 19000),in_DL,'\a'), iVar1 == 0)))) {
      av1_get_skip_mode_context(in_RSI);
      aom_write_symbol((aom_writer *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),symb,in_R8,nsymbs);
      return nsymbs;
    }
  }
  return 0;
}

Assistant:

static int write_skip_mode(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                           uint8_t segment_id, const MB_MODE_INFO *mi,
                           aom_writer *w) {
  if (!cm->current_frame.skip_mode_info.skip_mode_flag) return 0;
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 0;
  }
  const int skip_mode = mi->skip_mode;
  if (!is_comp_ref_allowed(mi->bsize)) {
    assert(!skip_mode);
    return 0;
  }
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME) ||
      segfeature_active(&cm->seg, segment_id, SEG_LVL_GLOBALMV)) {
    // These features imply single-reference mode, while skip mode implies
    // compound reference. Hence, the two are mutually exclusive.
    // In other words, skip_mode is implicitly 0 here.
    assert(!skip_mode);
    return 0;
  }
  const int ctx = av1_get_skip_mode_context(xd);
  aom_write_symbol(w, skip_mode, xd->tile_ctx->skip_mode_cdfs[ctx], 2);
  return skip_mode;
}